

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

ExpressionValue * __thiscall
ExpressionValue::operator+
          (ExpressionValue *__return_storage_ptr__,ExpressionValue *this,ExpressionValue *other)

{
  StringLiteral *this_00;
  ExpressionValueType EVar1;
  double dVar2;
  StringLiteral local_f0;
  StringLiteral local_d0;
  anon_union_8_2_b358304e_for_ExpressionValue_1 local_b0;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  (__return_storage_ptr__->strValue)._value._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->strValue)._value.field_2;
  (__return_storage_ptr__->strValue)._value._M_string_length = 0;
  (__return_storage_ptr__->strValue)._value.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->type = Invalid;
  (__return_storage_ptr__->field_1).intValue = 0;
  EVar1 = this->type << 2 | other->type;
  if (10 < EVar1 - 5) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->strValue;
  switch(EVar1) {
  case 5:
    __return_storage_ptr__->type = Integer;
    (__return_storage_ptr__->field_1).intValue =
         (other->field_1).intValue + (this->field_1).intValue;
    return __return_storage_ptr__;
  case 6:
    __return_storage_ptr__->type = Float;
    dVar2 = (double)(this->field_1).intValue;
    goto LAB_00179b91;
  case 7:
    __return_storage_ptr__->type = String;
    local_b0 = this->field_1;
    tinyformat::format<long>(&local_48,"%d",&local_b0.intValue);
    StringLiteral::StringLiteral(&local_f0,&local_48);
    StringLiteral::operator+(&local_d0,&local_f0,&other->strValue);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._value._M_dataplus._M_p != &local_d0._value.field_2) {
      operator_delete(local_d0._value._M_dataplus._M_p,
                      local_d0._value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._value._M_dataplus._M_p != &local_f0._value.field_2) {
      operator_delete(local_f0._value._M_dataplus._M_p,
                      local_f0._value.field_2._M_allocated_capacity + 1);
    }
    local_d0._value.field_2._M_allocated_capacity = local_48.field_2._M_allocated_capacity;
    local_d0._value._M_dataplus._M_p = local_48._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return __return_storage_ptr__;
    }
    break;
  default:
    goto switchD_00179880_caseD_8;
  case 9:
    __return_storage_ptr__->type = Float;
    dVar2 = (double)(other->field_1).intValue + (this->field_1).floatValue;
    goto LAB_00179b97;
  case 10:
    __return_storage_ptr__->type = Float;
    dVar2 = (this->field_1).floatValue;
LAB_00179b91:
    dVar2 = dVar2 + (other->field_1).floatValue;
LAB_00179b97:
    (__return_storage_ptr__->field_1).floatValue = dVar2;
    return __return_storage_ptr__;
  case 0xb:
    __return_storage_ptr__->type = String;
    local_b0 = this->field_1;
    tinyformat::format<double>(&local_68,"%#.17g",&local_b0.floatValue);
    StringLiteral::StringLiteral(&local_f0,&local_68);
    StringLiteral::operator+(&local_d0,&local_f0,&other->strValue);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._value._M_dataplus._M_p != &local_d0._value.field_2) {
      operator_delete(local_d0._value._M_dataplus._M_p,
                      local_d0._value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._value._M_dataplus._M_p != &local_f0._value.field_2) {
      operator_delete(local_f0._value._M_dataplus._M_p,
                      local_f0._value.field_2._M_allocated_capacity + 1);
    }
    local_d0._value.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
    local_d0._value._M_dataplus._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return __return_storage_ptr__;
    }
    break;
  case 0xd:
    __return_storage_ptr__->type = String;
    local_b0 = other->field_1;
    tinyformat::format<long>(&local_88,"%d",&local_b0.intValue);
    StringLiteral::StringLiteral(&local_f0,&local_88);
    StringLiteral::operator+(&local_d0,&this->strValue,&local_f0);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._value._M_dataplus._M_p != &local_d0._value.field_2) {
      operator_delete(local_d0._value._M_dataplus._M_p,
                      local_d0._value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._value._M_dataplus._M_p != &local_f0._value.field_2) {
      operator_delete(local_f0._value._M_dataplus._M_p,
                      local_f0._value.field_2._M_allocated_capacity + 1);
    }
    local_d0._value.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
    local_d0._value._M_dataplus._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
    break;
  case 0xe:
    __return_storage_ptr__->type = String;
    local_b0 = other->field_1;
    tinyformat::format<double>(&local_a8,"%#.17g",&local_b0.floatValue);
    StringLiteral::StringLiteral(&local_f0,&local_a8);
    StringLiteral::operator+(&local_d0,&this->strValue,&local_f0);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._value._M_dataplus._M_p != &local_d0._value.field_2) {
      operator_delete(local_d0._value._M_dataplus._M_p,
                      local_d0._value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._value._M_dataplus._M_p != &local_f0._value.field_2) {
      operator_delete(local_f0._value._M_dataplus._M_p,
                      local_f0._value.field_2._M_allocated_capacity + 1);
    }
    local_d0._value.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
    local_d0._value._M_dataplus._M_p = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      return __return_storage_ptr__;
    }
    break;
  case 0xf:
    __return_storage_ptr__->type = String;
    StringLiteral::operator+(&local_d0,&this->strValue,&other->strValue);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._value._M_dataplus._M_p == &local_d0._value.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_d0._value._M_dataplus._M_p,local_d0._value.field_2._M_allocated_capacity + 1
                 );
switchD_00179880_caseD_8:
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionValue::operator+(const ExpressionValue& other) const
{
	ExpressionValue result;
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.type = ExpressionValueType::Integer;
		result.intValue = intValue + other.intValue;
		break;
	case ExpressionValueCombination::FI:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue + other.intValue;
		break;
	case ExpressionValueCombination::IF:
		result.type = ExpressionValueType::Float;
		result.floatValue = intValue + other.floatValue;
		break;
	case ExpressionValueCombination::FF:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue + other.floatValue;
		break;
	case ExpressionValueCombination::IS:
		result.type = ExpressionValueType::String;
		result.strValue = StringLiteral(to_string(intValue)) + other.strValue;
		break;
	case ExpressionValueCombination::FS:
		result.type = ExpressionValueType::String;
		result.strValue = StringLiteral(to_string(floatValue)) + other.strValue;
		break;
	case ExpressionValueCombination::SI:
		result.type = ExpressionValueType::String;
		result.strValue = strValue + to_string(other.intValue);
		break;
	case ExpressionValueCombination::SF:
		result.type = ExpressionValueType::String;
		result.strValue = strValue + to_string(other.floatValue);
		break;
	case ExpressionValueCombination::SS:
		result.type = ExpressionValueType::String;
		result.strValue = strValue + other.strValue;
		break;
	}

	return result;
}